

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O3

void clear(void)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  start = true;
  if (-2 < bsize) {
    uVar3 = 0;
    iVar5 = bsize;
    do {
      if (iVar5 < -1) {
        lVar2 = (long)iVar5;
      }
      else {
        uVar4 = 0;
        do {
          board[uVar3][uVar4] =
               (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                    (long)(iVar5 + 1)) == 0 ||
               (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                    (long)(iVar5 + 1)) == 0;
          points[uVar3][uVar4] = 0;
          lVar2 = (long)bsize;
          bVar1 = (long)uVar4 <= lVar2;
          uVar4 = uVar4 + 1;
          iVar5 = bsize;
        } while (bVar1);
      }
      bVar1 = (long)uVar3 <= lVar2;
      uVar3 = uVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void clear() {
    start = true;
    for (int i = 0; i < bsize + 2; i++)
        for (int j = 0; j < bsize + 2; j++) {
            if ((i % (bsize + 1)) * (j % (bsize + 1)) == 0) board[i][j] = 1; else board[i][j] = 0;
            points[i][j] = 0;
        }
}